

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_atom.c
# Opt level: O0

void atom_string(t_atom *a,char *buf,uint bufsize)

{
  size_t sVar1;
  bool bVar2;
  char *ep;
  char *bp;
  int quote;
  uint len;
  char *sp;
  char tbuf [30];
  uint bufsize_local;
  char *buf_local;
  t_atom *a_local;
  
  switch(a->a_type) {
  case A_FLOAT:
    sprintf((char *)&sp,"%g",(double)(a->a_w).w_float);
    sVar1 = strlen((char *)&sp);
    if (sVar1 < bufsize - 1) {
      strcpy(buf,(char *)&sp);
    }
    else if (0.0 < (a->a_w).w_float || (a->a_w).w_float == 0.0) {
      strcpy(buf,"+");
    }
    else {
      strcpy(buf,"-");
    }
    break;
  case A_SYMBOL:
  case A_DOLLSYM:
    _quote = ((a->a_w).w_symbol)->s_name;
    bp._4_4_ = 0;
    bVar2 = false;
    for (; *_quote != '\0'; _quote = _quote + 1) {
      if (((((*_quote == ';') || (*_quote == ',')) || (*_quote == '\\')) || (*_quote == ' ')) ||
         (((a->a_type == A_SYMBOL && (*_quote == '$')) && (('/' < _quote[1] && (_quote[1] < ':')))))
         ) {
        bVar2 = true;
      }
      bp._4_4_ = bp._4_4_ + 1;
    }
    if (bVar2) {
      ep = buf;
      _quote = ((a->a_w).w_symbol)->s_name;
      while( true ) {
        bVar2 = false;
        if (ep < buf + (bufsize - 2)) {
          bVar2 = *_quote != '\0';
        }
        if (!bVar2) break;
        if ((((*_quote == ';') || (*_quote == ',')) || ((*_quote == '\\' || (*_quote == ' ')))) ||
           ((((a->a_type == A_SYMBOL && (*_quote == '$')) && ('/' < _quote[1])) && (_quote[1] < ':')
            ))) {
          *ep = '\\';
          ep = ep + 1;
        }
        *ep = *_quote;
        ep = ep + 1;
        _quote = _quote + 1;
      }
      if (*_quote != '\0') {
        *ep = '*';
        ep = ep + 1;
      }
      *ep = '\0';
    }
    else if (bp._4_4_ < bufsize - 1) {
      strcpy(buf,((a->a_w).w_symbol)->s_name);
    }
    else {
      strncpy(buf,((a->a_w).w_symbol)->s_name,(ulong)(bufsize - 2));
      strcpy(buf + (bufsize - 2),"*");
    }
    break;
  case A_POINTER:
    strcpy(buf,"(pointer)");
    break;
  case A_SEMI:
    strcpy(buf,";");
    break;
  case A_COMMA:
    strcpy(buf,",");
    break;
  default:
    bug("atom_string");
    break;
  case A_DOLLAR:
    sprintf(buf,"$%d",(ulong)(uint)(a->a_w).w_index);
  }
  return;
}

Assistant:

void atom_string(const t_atom *a, char *buf, unsigned int bufsize)
{
    char tbuf[30];
    switch(a->a_type)
    {
    case A_SEMI: strcpy(buf, ";"); break;
    case A_COMMA: strcpy(buf, ","); break;
    case A_POINTER:
        strcpy(buf, "(pointer)");
        break;
    case A_FLOAT:
        sprintf(tbuf, "%g", a->a_w.w_float);
        if (strlen(tbuf) < bufsize-1) strcpy(buf, tbuf);
        else if (a->a_w.w_float < 0) strcpy(buf, "-");
        else  strcpy(buf, "+");
        break;
    case A_SYMBOL:
    case A_DOLLSYM:
    {
        const char *sp;
        unsigned int len;
        int quote;
        for (sp = a->a_w.w_symbol->s_name, len = 0, quote = 0; *sp; sp++, len++)
            if (*sp == ';' || *sp == ',' || *sp == '\\' || *sp == ' ' ||
                (a->a_type == A_SYMBOL && *sp == '$' &&
                    sp[1] >= '0' && sp[1] <= '9'))
                        quote = 1;
        if (quote)
        {
            char *bp = buf, *ep = buf + (bufsize-2);
            sp = a->a_w.w_symbol->s_name;
            while (bp < ep && *sp)
            {
                if (*sp == ';' || *sp == ',' || *sp == '\\' || *sp == ' ' ||
                    (a->a_type == A_SYMBOL && *sp == '$' &&
                        sp[1] >= '0' && sp[1] <= '9'))
                            *bp++ = '\\';
                *bp++ = *sp++;
            }
            if (*sp) *bp++ = '*';
            *bp = 0;
            /* post("quote %s -> %s", a->a_w.w_symbol->s_name, buf); */
        }
        else
        {
            if (len < bufsize-1) strcpy(buf, a->a_w.w_symbol->s_name);
            else
            {
                strncpy(buf, a->a_w.w_symbol->s_name, bufsize - 2);
                strcpy(buf + (bufsize - 2), "*");
            }
        }
    }
        break;
    case A_DOLLAR:
        sprintf(buf, "$%d", a->a_w.w_index);
        break;
    default:
        bug("atom_string");
    }
}